

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  char cVar1;
  long *in_RAX;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  long *local_28;
  
  local_28 = in_RAX;
  testing::Message::Message((Message *)&local_28);
  __s = *value;
  poVar3 = (ostream *)(local_28 + 2);
  if (__s == (char *)0x0) {
    sVar2 = 6;
    __s = "(null)";
  }
  else {
    sVar2 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  AppendMessage(this,(Message *)&local_28);
  if (local_28 != (long *)0x0) {
    cVar1 = testing::internal::IsTrue(true);
    if ((cVar1 != '\0') && (local_28 != (long *)0x0)) {
      (**(code **)(*local_28 + 8))();
    }
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }